

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O0

void __thiscall hwnet::TCPSocket::Send(TCPSocket *this,string *str)

{
  string *local_18;
  string *str_local;
  TCPSocket *this_local;
  
  local_18 = str;
  str_local = (string *)this;
  Buffer::New((Buffer *)&stack0xffffffffffffffd8,str);
  Send(this,(Ptr *)&stack0xffffffffffffffd8,0);
  std::shared_ptr<hwnet::Buffer>::~shared_ptr((shared_ptr<hwnet::Buffer> *)&stack0xffffffffffffffd8)
  ;
  return;
}

Assistant:

void TCPSocket::Send(const std::string &str) {
	this->Send(Buffer::New(str),0);
}